

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunSomeIndexTests.cpp
# Opt level: O3

int main(int ac,char **av)

{
  int iVar1;
  char *__haystack;
  char *pcVar2;
  clock_t cVar3;
  clock_t cVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  int testNum;
  uint local_34;
  
  local_34 = 0;
  if (ac < 2) {
    puts("Available tests:");
    printf("%3d. %s\n",0,"utilitytest");
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&local_34);
    if (iVar1 != 1) {
      pcVar6 = "Couldn\'t parse that input as a number";
LAB_0010a369:
      puts(pcVar6);
      return -1;
    }
    if (0 < (int)local_34) {
      pcVar6 = "%3d is an invalid test number.\n";
      goto LAB_0010a4a4;
    }
    ac = ac + -1;
    av = av + 1;
    uVar5 = local_34;
    if (local_34 == 0xffffffff) goto LAB_0010a378;
  }
  else {
    pcVar6 = av[1];
    if (*pcVar6 == '-') {
      if (pcVar6[1] == 'R') {
        bVar8 = pcVar6[2] == '\0';
        if (ac == 2 && bVar8) {
          pcVar6 = "-R needs an additional parameter.";
          goto LAB_0010a369;
        }
        uVar7 = (ulong)(pcVar6[2] == '\0');
      }
      else {
        uVar7 = 0;
        bVar8 = false;
      }
      if ((pcVar6[1] == 'A') && (pcVar6[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",1);
        if (ac != 2) {
          uVar7 = 0;
          do {
            iVar1 = strcmp("utilitytest",av[uVar7 + 2]);
            if (iVar1 == 0) {
              printf("ok %d %s # SKIP\n",1,"utilitytest");
              goto LAB_0010a57f;
            }
            uVar7 = uVar7 + 1;
          } while (ac - 2 != uVar7);
        }
        cVar3 = clock();
        iVar1 = utilitytest(ac,av);
        cVar4 = clock();
        pcVar6 = "ok";
        if (iVar1 == -1) {
          pcVar6 = "not ok";
        }
        printf("%s %d %s # %f\n",(double)(cVar4 - cVar3) / 1000000.0,pcVar6,1,"utilitytest");
LAB_0010a57f:
        puts("All tests finished.");
        return 0;
      }
    }
    else {
LAB_0010a378:
      bVar8 = false;
      uVar7 = 0;
    }
    pcVar6 = lowercase(av[uVar7 + 1]);
    __haystack = lowercase("utilitytest");
    if ((bVar8) && (pcVar2 = strstr(__haystack,pcVar6), pcVar2 != (char *)0x0)) {
      ac = ac + -2;
      av = av + 2;
LAB_0010a434:
      bVar8 = false;
      uVar5 = 0;
    }
    else {
      uVar5 = 0xffffffff;
      bVar8 = true;
      if (((int)uVar7 == 0) && (iVar1 = strcmp(__haystack,pcVar6), iVar1 == 0)) {
        ac = ac + -1;
        av = av + 1;
        goto LAB_0010a434;
      }
    }
    free(__haystack);
    free(pcVar6);
    if (bVar8) {
      puts("Available tests:");
      printf("%3d. %s\n",0,"utilitytest");
      printf("Failed: %s is an invalid test name.\n",av[1]);
      return -1;
    }
  }
  if (-1 < (int)uVar5) {
    iVar1 = utilitytest(ac,av);
    return iVar1;
  }
  pcVar6 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_0010a4a4:
  printf(pcVar6,(ulong)local_34);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}